

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qrhigles2.cpp
# Opt level: O0

ProgramCacheResult __thiscall
QRhiGles2::tryLoadFromDiskOrPipelineCache
          (QRhiGles2 *this,QRhiShaderStage *stages,int stageCount,GLuint program,
          QVector<QShaderDescription::InOutVariable> *inputVars,QByteArray *cacheKey)

{
  uint uVar1;
  bool bVar2;
  bool bVar3;
  Type TVar4;
  GLenum GVar5;
  QRhiGles2 *this_00;
  int *piVar6;
  PipelineCacheData *pPVar7;
  char *pcVar8;
  Stage in_ECX;
  int in_EDX;
  long in_RSI;
  long in_RDI;
  QShaderVersion *in_R8;
  long in_FS_OFFSET;
  GLenum err;
  InOutVariable *var;
  QVector<QShaderDescription::InOutVariable> *__range4;
  QRhiShaderStage *stage;
  int i;
  bool pipelineCacheEnabled;
  bool legacyDiskCacheEnabled;
  GLint linkStatus;
  const_iterator it_1;
  const_iterator end;
  const_iterator it;
  const_iterator __end4;
  const_iterator __begin4;
  QMap<QByteArray,_int> inputLocations;
  QByteArray source;
  ProgramDesc binaryProgram;
  QLoggingCategoryMacroHolder<(QtMsgType)0> qt_category;
  GLenum in_stack_fffffffffffffdf8;
  Stage in_stack_fffffffffffffdfc;
  QRhiGles2 *in_stack_fffffffffffffe00;
  Stage in_stack_fffffffffffffe08;
  quint32 in_stack_fffffffffffffe0c;
  QMessageLogger *in_stack_fffffffffffffe10;
  uint in_stack_fffffffffffffe28;
  undefined4 in_stack_fffffffffffffe2c;
  QShaderVersion *in_stack_fffffffffffffe40;
  undefined4 in_stack_fffffffffffffe48;
  undefined4 in_stack_fffffffffffffe4c;
  int iVar9;
  int local_1a8;
  long lVar10;
  uint programId;
  undefined4 in_stack_fffffffffffffe88;
  ProgramCacheResult in_stack_fffffffffffffe8c;
  QOpenGLProgramBinaryCache *in_stack_fffffffffffffe90;
  QArrayDataPointer<char> local_f0 [2];
  undefined1 local_c0 [24];
  const_iterator local_a8;
  const_iterator local_a0;
  QArrayDataPointer<char> local_98 [2];
  InOutVariable *local_68;
  const_iterator local_60;
  const_iterator local_58;
  undefined1 *local_50;
  undefined1 *local_48;
  undefined1 *local_40;
  undefined1 *local_38;
  undefined1 *local_30;
  undefined1 *local_28;
  undefined1 *local_20;
  undefined1 *local_18;
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  lVar10 = in_RDI;
  bVar2 = isProgramBinaryDiskCacheEnabled(in_stack_fffffffffffffe00);
  in_stack_fffffffffffffe28 = in_stack_fffffffffffffe28 & 0xffffff;
  if ((*(uint *)(in_RDI + 0x24c) >> 0x1e & 1) != 0) {
    bVar3 = QHash<QByteArray,_QRhiGles2::PipelineCacheData>::isEmpty
                      ((QHash<QByteArray,_QRhiGles2::PipelineCacheData> *)(in_RDI + 0x870));
    in_stack_fffffffffffffe28 = CONCAT13(bVar3,(int3)in_stack_fffffffffffffe28) ^ 0xff000000;
  }
  uVar1 = in_stack_fffffffffffffe28 & 0x1000000;
  if ((bVar2) || ((in_stack_fffffffffffffe28 & 0x1000000) != 0)) {
    local_30 = &DAT_aaaaaaaaaaaaaaaa;
    local_28 = &DAT_aaaaaaaaaaaaaaaa;
    local_20 = &DAT_aaaaaaaaaaaaaaaa;
    QOpenGLProgramBinaryCache::ProgramDesc::ProgramDesc((ProgramDesc *)0x92b412);
    for (local_1a8 = 0; local_1a8 < in_EDX; local_1a8 = local_1a8 + 1) {
      this_00 = (QRhiGles2 *)(in_RSI + (long)local_1a8 * 0x18);
      local_48 = &DAT_aaaaaaaaaaaaaaaa;
      local_40 = &DAT_aaaaaaaaaaaaaaaa;
      local_38 = &DAT_aaaaaaaaaaaaaaaa;
      shaderSource(this_00,(QRhiShaderStage *)
                           CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48),
                   in_stack_fffffffffffffe40);
      bVar3 = QByteArray::isEmpty((QByteArray *)0x92b4a5);
      if (bVar3) {
        in_stack_fffffffffffffe8c = ProgramCacheError;
        iVar9 = 1;
      }
      else {
        TVar4 = QRhiShaderStage::type((QRhiShaderStage *)this_00);
        if (TVar4 == Vertex) {
          local_50 = &DAT_aaaaaaaaaaaaaaaa;
          QMap<QByteArray,_int>::QMap((QMap<QByteArray,_int> *)0x92b4f2);
          local_58.i = (InOutVariable *)&DAT_aaaaaaaaaaaaaaaa;
          in_stack_fffffffffffffe40 = in_R8;
          local_58 = QList<QShaderDescription::InOutVariable>::begin
                               ((QList<QShaderDescription::InOutVariable> *)
                                in_stack_fffffffffffffe00);
          local_60.i = (InOutVariable *)&DAT_aaaaaaaaaaaaaaaa;
          local_60 = QList<QShaderDescription::InOutVariable>::end
                               ((QList<QShaderDescription::InOutVariable> *)
                                in_stack_fffffffffffffe00);
          while( true ) {
            local_68 = local_60.i;
            bVar3 = QList<QShaderDescription::InOutVariable>::const_iterator::operator!=
                              (&local_58,local_60);
            if (!bVar3) break;
            QList<QShaderDescription::InOutVariable>::const_iterator::operator*(&local_58);
            QMap<QByteArray,_int>::insert
                      ((QMap<QByteArray,_int> *)in_stack_fffffffffffffe10,
                       (QByteArray *)CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08),
                       (int *)in_stack_fffffffffffffe00);
            QList<QShaderDescription::InOutVariable>::const_iterator::operator++(&local_58);
          }
          QArrayDataPointer<char>::QArrayDataPointer(local_98,(Data *)0x0,"\n // ",5);
          QByteArray::QByteArray
                    ((QByteArray *)in_stack_fffffffffffffe00,
                     (DataPointer *)CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8));
          QByteArray::operator+=
                    ((QByteArray *)in_stack_fffffffffffffe00,
                     (QByteArray *)CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8));
          QByteArray::~QByteArray((QByteArray *)0x92b61c);
          QArrayDataPointer<char>::~QArrayDataPointer
                    ((QArrayDataPointer<char> *)in_stack_fffffffffffffe00);
          local_a0._M_node = (_Base_ptr)&DAT_aaaaaaaaaaaaaaaa;
          local_a0._M_node =
               (_Base_ptr)
               QMap<QByteArray,_int>::cbegin
                         ((QMap<QByteArray,_int> *)
                          CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8));
          local_a8._M_node = (_Base_ptr)&DAT_aaaaaaaaaaaaaaaa;
          local_a8._M_node =
               (_Base_ptr)
               QMap<QByteArray,_int>::cend
                         ((QMap<QByteArray,_int> *)
                          CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8));
          while (bVar3 = ::operator!=((const_iterator *)in_stack_fffffffffffffe00,
                                      (const_iterator *)
                                      CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8))
                , bVar3) {
            QMap<QByteArray,_int>::const_iterator::key((const_iterator *)0x92b699);
            QByteArray::operator+=
                      ((QByteArray *)in_stack_fffffffffffffe00,
                       (QByteArray *)CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8));
            piVar6 = QMap<QByteArray,_int>::const_iterator::value((const_iterator *)0x92b6b6);
            QByteArray::number((int)local_c0,*piVar6);
            QByteArray::operator+=
                      ((QByteArray *)in_stack_fffffffffffffe00,
                       (QByteArray *)CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8));
            QByteArray::~QByteArray((QByteArray *)0x92b6ec);
            QMap<QByteArray,_int>::const_iterator::operator++
                      ((const_iterator *)in_stack_fffffffffffffe00);
          }
          QArrayDataPointer<char>::QArrayDataPointer(local_f0,(Data *)0x0,"\n",1);
          QByteArray::QByteArray
                    ((QByteArray *)in_stack_fffffffffffffe00,
                     (DataPointer *)CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8));
          QByteArray::operator+=
                    ((QByteArray *)in_stack_fffffffffffffe00,
                     (QByteArray *)CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8));
          QByteArray::~QByteArray((QByteArray *)0x92b752);
          QArrayDataPointer<char>::~QArrayDataPointer
                    ((QArrayDataPointer<char> *)in_stack_fffffffffffffe00);
          QMap<QByteArray,_int>::~QMap((QMap<QByteArray,_int> *)0x92b76c);
        }
        TVar4 = QRhiShaderStage::type((QRhiShaderStage *)this_00);
        toShaderStage(TVar4);
        QOpenGLProgramBinaryCache::ShaderDesc::ShaderDesc
                  ((ShaderDesc *)in_stack_fffffffffffffe00,in_stack_fffffffffffffdfc,
                   (QByteArray *)0x92b7a1);
        QList<QOpenGLProgramBinaryCache::ShaderDesc>::append
                  ((QList<QOpenGLProgramBinaryCache::ShaderDesc> *)in_stack_fffffffffffffe00,
                   (rvalue_ref)CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8));
        QOpenGLProgramBinaryCache::ShaderDesc::~ShaderDesc((ShaderDesc *)0x92b7c0);
        iVar9 = 0;
      }
      QByteArray::~QByteArray((QByteArray *)0x92b7d5);
      if (iVar9 != 0) goto LAB_0092baca;
      in_stack_fffffffffffffe4c = 0;
    }
    QOpenGLProgramBinaryCache::ProgramDesc::cacheKey
              ((ProgramDesc *)CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28));
    QByteArray::operator=
              ((QByteArray *)in_stack_fffffffffffffe00,
               (QByteArray *)CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8));
    QByteArray::~QByteArray((QByteArray *)0x92b829);
    programId = (uint)((ulong)lVar10 >> 0x20);
    if (uVar1 != 0) {
      QHash<QByteArray,_QRhiGles2::PipelineCacheData>::constFind
                ((QHash<QByteArray,_QRhiGles2::PipelineCacheData> *)in_stack_fffffffffffffe00,
                 (QByteArray *)CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8));
      QHash<QByteArray,_QRhiGles2::PipelineCacheData>::constEnd
                ((QHash<QByteArray,_QRhiGles2::PipelineCacheData> *)
                 CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08));
      bVar3 = QHash<QByteArray,_QRhiGles2::PipelineCacheData>::const_iterator::operator!=
                        ((const_iterator *)
                         CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08),
                         (const_iterator *)in_stack_fffffffffffffe00);
      programId = (uint)((ulong)lVar10 >> 0x20);
      if (bVar3) {
        do {
          GVar5 = QOpenGLFunctions::glGetError((QOpenGLFunctions *)in_stack_fffffffffffffe00);
          programId = (uint)((ulong)lVar10 >> 0x20);
          if (GVar5 == 0) break;
        } while (GVar5 != 0x507);
        in_stack_fffffffffffffe00 = *(QRhiGles2 **)(in_RDI + 400);
        in_stack_fffffffffffffe08 = in_ECX;
        pPVar7 = QHash<QByteArray,_QRhiGles2::PipelineCacheData>::const_iterator::operator->
                           ((const_iterator *)0x92b90f);
        in_stack_fffffffffffffe0c = pPVar7->format;
        QHash<QByteArray,_QRhiGles2::PipelineCacheData>::const_iterator::operator->
                  ((const_iterator *)0x92b922);
        in_stack_fffffffffffffe10 = (QMessageLogger *)QByteArray::constData((QByteArray *)0x92b92e);
        pPVar7 = QHash<QByteArray,_QRhiGles2::PipelineCacheData>::const_iterator::operator->
                           ((const_iterator *)0x92b940);
        QByteArray::size(&pPVar7->data);
        QOpenGLExtraFunctions::glProgramBinary
                  ((QOpenGLExtraFunctions *)in_stack_fffffffffffffe10,in_stack_fffffffffffffe0c,
                   in_stack_fffffffffffffe08,in_stack_fffffffffffffe00,in_stack_fffffffffffffdfc);
        GVar5 = QOpenGLFunctions::glGetError((QOpenGLFunctions *)in_stack_fffffffffffffe00);
        if (GVar5 == 0) {
          QOpenGLFunctions::glGetProgramiv
                    ((QOpenGLFunctions *)in_stack_fffffffffffffe00,in_stack_fffffffffffffdfc,
                     in_stack_fffffffffffffdf8,(GLint *)0x92b9af);
        }
      }
    }
    if (bVar2) {
      QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_qrhi_programBinaryCache>_>::
      operator()((QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_qrhi_programBinaryCache>_>
                  *)CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8));
      bVar2 = QOpenGLProgramBinaryCache::load
                        (in_stack_fffffffffffffe90,
                         (QByteArray *)CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88)
                         ,programId);
      if (!bVar2) goto LAB_0092bac2;
      local_18 = &DAT_aaaaaaaaaaaaaaaa;
      local_10 = &DAT_aaaaaaaaaaaaaaaa;
      QtPrivateLogging::lcOpenGLProgramDiskCache();
      anon_unknown.dwarf_17a65a2::QLoggingCategoryMacroHolder<(QtMsgType)0>::
      QLoggingCategoryMacroHolder
                ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)in_stack_fffffffffffffe00,
                 (QLoggingCategory *)CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8));
      while (bVar2 = (anonymous_namespace)::QLoggingCategoryMacroHolder::operator_cast_to_bool
                               ((QLoggingCategoryMacroHolder *)&local_18), bVar2) {
        anon_unknown.dwarf_17a65a2::QLoggingCategoryMacroHolder<(QtMsgType)0>::name
                  ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)0x92ba5b);
        QMessageLogger::QMessageLogger
                  (in_stack_fffffffffffffe10,
                   (char *)CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08),
                   (int)((ulong)in_stack_fffffffffffffe00 >> 0x20),
                   (char *)CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8),
                   (char *)0x92ba74);
        in_stack_fffffffffffffdfc = in_ECX;
        pcVar8 = QByteArray::constData((QByteArray *)0x92ba86);
        QMessageLogger::debug
                  (&stack0xfffffffffffffe90,"Program binary received from cache, program %u, key %s"
                   ,(ulong)in_stack_fffffffffffffdfc,pcVar8);
        local_10 = (undefined1 *)((ulong)local_10 & 0xffffffffffffff00);
      }
      in_stack_fffffffffffffe8c = ProgramCacheHit;
      iVar9 = 1;
    }
    else {
LAB_0092bac2:
      iVar9 = 0;
    }
LAB_0092baca:
    QOpenGLProgramBinaryCache::ProgramDesc::~ProgramDesc((ProgramDesc *)0x92bad7);
    if (iVar9 != 0) goto LAB_0092baf0;
  }
  in_stack_fffffffffffffe8c = ProgramCacheMiss;
LAB_0092baf0:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return in_stack_fffffffffffffe8c;
  }
  __stack_chk_fail();
}

Assistant:

QRhiGles2::ProgramCacheResult QRhiGles2::tryLoadFromDiskOrPipelineCache(const QRhiShaderStage *stages,
                                                                        int stageCount,
                                                                        GLuint program,
                                                                        const QVector<QShaderDescription::InOutVariable> &inputVars,
                                                                        QByteArray *cacheKey)
{
    Q_ASSERT(cacheKey);

    // the traditional QOpenGL disk cache since Qt 5.9
    const bool legacyDiskCacheEnabled = isProgramBinaryDiskCacheEnabled();

    // QRhi's own (set)PipelineCacheData()
    const bool pipelineCacheEnabled = caps.programBinary && !m_pipelineCache.isEmpty();

    // calculating the cache key based on the source code is common for both types of caches
    if (legacyDiskCacheEnabled || pipelineCacheEnabled) {
        QOpenGLProgramBinaryCache::ProgramDesc binaryProgram;
        for (int i = 0; i < stageCount; ++i) {
            const QRhiShaderStage &stage(stages[i]);
            QByteArray source = shaderSource(stage, nullptr);
            if (source.isEmpty())
                return QRhiGles2::ProgramCacheError;

            if (stage.type() == QRhiShaderStage::Vertex) {
                // Now add something to the key that indicates the vertex input locations.
                // A GLSL shader lower than 330 (150, 140, ...) will not have location
                // qualifiers. This means that the shader source code is the same
                // regardless of what locations inputVars contains. This becomes a problem
                // because we'll glBindAttribLocation the shader based on inputVars, but
                // that's only when compiling/linking when there was no cache hit. Picking
                // from the cache afterwards should take the input locations into account
                // since if inputVars has now different locations for the attributes, then
                // it is not ok to reuse a program binary that used different attribute
                // locations. For a lot of clients this would not be an issue since they
                // typically hardcode and use the same vertex locations on every run. Some
                // systems that dynamically generate shaders may end up with a non-stable
                // order (and so location numbers), however. This is sub-optimal because
                // it makes caching inefficient, and said clients should be fixed, but in
                // any case this should not break rendering. Hence including the locations
                // in the cache key.
                QMap<QByteArray, int> inputLocations; // sorted by key when iterating
                for (const QShaderDescription::InOutVariable &var : inputVars)
                    inputLocations.insert(var.name, var.location);
                source += QByteArrayLiteral("\n // "); // just to be nice; treated as an arbitrary string regardless
                for (auto it = inputLocations.cbegin(), end = inputLocations.cend(); it != end; ++it) {
                    source += it.key();
                    source += QByteArray::number(it.value());
                }
                source += QByteArrayLiteral("\n");
            }

            binaryProgram.shaders.append(QOpenGLProgramBinaryCache::ShaderDesc(toShaderStage(stage.type()), source));
        }

        *cacheKey = binaryProgram.cacheKey();

        // Try our pipeline cache simulation first, if it got seeded with
        // setPipelineCacheData and there's a hit, then no need to go to the
        // filesystem at all.
        if (pipelineCacheEnabled) {
            auto it = m_pipelineCache.constFind(*cacheKey);
            if (it != m_pipelineCache.constEnd()) {
                GLenum err;
                for ( ; ; ) {
                    err = f->glGetError();
                    if (err == GL_NO_ERROR || err == GL_CONTEXT_LOST)
                        break;
                }
                f->glProgramBinary(program, it->format, it->data.constData(), it->data.size());
                err = f->glGetError();
                if (err == GL_NO_ERROR) {
                    GLint linkStatus = 0;
                    f->glGetProgramiv(program, GL_LINK_STATUS, &linkStatus);
                    if (linkStatus == GL_TRUE)
                        return QRhiGles2::ProgramCacheHit;
                }
            }
        }

        if (legacyDiskCacheEnabled && qrhi_programBinaryCache()->load(*cacheKey, program)) {
            // use the logging category QOpenGLShaderProgram would
            qCDebug(lcOpenGLProgramDiskCache, "Program binary received from cache, program %u, key %s",
                    program, cacheKey->constData());
            return QRhiGles2::ProgramCacheHit;
        }
    }

    return QRhiGles2::ProgramCacheMiss;
}